

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O0

void bmpmask32toimage(OPJ_UINT8 *pData,OPJ_UINT32 stride,opj_image_t *image,OPJ_UINT32 redMask,
                     OPJ_UINT32 greenMask,OPJ_UINT32 blueMask,OPJ_UINT32 alphaMask)

{
  uint uVar1;
  OPJ_UINT32 local_6c;
  OPJ_UINT32 value;
  OPJ_UINT32 alphaPrec;
  OPJ_UINT32 alphaShift;
  OPJ_UINT32 bluePrec;
  OPJ_UINT32 blueShift;
  OPJ_UINT32 greenPrec;
  OPJ_UINT32 greenShift;
  OPJ_UINT32 redPrec;
  OPJ_UINT32 redShift;
  OPJ_BOOL hasAlpha;
  OPJ_UINT8 *pSrc;
  OPJ_UINT32 y;
  OPJ_UINT32 x;
  OPJ_UINT32 height;
  OPJ_UINT32 width;
  int index;
  OPJ_UINT32 blueMask_local;
  OPJ_UINT32 greenMask_local;
  OPJ_UINT32 redMask_local;
  opj_image_t *image_local;
  OPJ_UINT8 *pOStack_10;
  OPJ_UINT32 stride_local;
  OPJ_UINT8 *pData_local;
  
  _redShift = (OPJ_UINT8 *)0x0;
  x = image->comps->w;
  y = image->comps->h;
  redPrec = (OPJ_UINT32)(3 < image->numcomps);
  width = blueMask;
  index = greenMask;
  blueMask_local = redMask;
  _greenMask_local = image;
  image_local._4_4_ = stride;
  pOStack_10 = pData;
  bmp_mask_get_shift_and_prec(redMask,&greenShift,&greenPrec);
  bmp_mask_get_shift_and_prec(index,&blueShift,&bluePrec);
  bmp_mask_get_shift_and_prec(width,&alphaShift,&alphaPrec);
  bmp_mask_get_shift_and_prec(alphaMask,&value,&local_6c);
  _greenMask_local->comps->bpp = greenPrec;
  _greenMask_local->comps->prec = greenPrec;
  _greenMask_local->comps[1].bpp = bluePrec;
  _greenMask_local->comps[1].prec = bluePrec;
  _greenMask_local->comps[2].bpp = alphaPrec;
  _greenMask_local->comps[2].prec = alphaPrec;
  if (redPrec != 0) {
    _greenMask_local->comps[3].bpp = local_6c;
    _greenMask_local->comps[3].prec = local_6c;
  }
  height = 0;
  _redShift = pOStack_10 + (y - 1) * image_local._4_4_;
  for (pSrc._0_4_ = 0; (uint)pSrc < y; pSrc._0_4_ = (uint)pSrc + 1) {
    for (pSrc._4_4_ = 0; pSrc._4_4_ < x; pSrc._4_4_ = pSrc._4_4_ + 1) {
      uVar1 = CONCAT13(_redShift[pSrc._4_4_ * 4 + 3],
                       CONCAT12(_redShift[pSrc._4_4_ * 4 + 2],
                                CONCAT11(_redShift[pSrc._4_4_ * 4 + 1],_redShift[pSrc._4_4_ << 2])))
      ;
      _greenMask_local->comps->data[(int)height] =
           (uVar1 & blueMask_local) >> ((byte)greenShift & 0x1f);
      _greenMask_local->comps[1].data[(int)height] = (uVar1 & index) >> ((byte)blueShift & 0x1f);
      _greenMask_local->comps[2].data[(int)height] = (uVar1 & width) >> ((byte)alphaShift & 0x1f);
      if (redPrec != 0) {
        _greenMask_local->comps[3].data[(int)height] = (uVar1 & alphaMask) >> ((byte)value & 0x1f);
      }
      height = height + 1;
    }
    _redShift = _redShift + -(ulong)image_local._4_4_;
  }
  return;
}

Assistant:

static void bmpmask32toimage(const OPJ_UINT8* pData, OPJ_UINT32 stride,
                             opj_image_t* image, OPJ_UINT32 redMask, OPJ_UINT32 greenMask,
                             OPJ_UINT32 blueMask, OPJ_UINT32 alphaMask)
{
    int index;
    OPJ_UINT32 width, height;
    OPJ_UINT32 x, y;
    const OPJ_UINT8 *pSrc = NULL;
    OPJ_BOOL hasAlpha;
    OPJ_UINT32 redShift,   redPrec;
    OPJ_UINT32 greenShift, greenPrec;
    OPJ_UINT32 blueShift,  bluePrec;
    OPJ_UINT32 alphaShift, alphaPrec;

    width  = image->comps[0].w;
    height = image->comps[0].h;

    hasAlpha = image->numcomps > 3U;

    bmp_mask_get_shift_and_prec(redMask,   &redShift,   &redPrec);
    bmp_mask_get_shift_and_prec(greenMask, &greenShift, &greenPrec);
    bmp_mask_get_shift_and_prec(blueMask,  &blueShift,  &bluePrec);
    bmp_mask_get_shift_and_prec(alphaMask, &alphaShift, &alphaPrec);

    image->comps[0].bpp = redPrec;
    image->comps[0].prec = redPrec;
    image->comps[1].bpp = greenPrec;
    image->comps[1].prec = greenPrec;
    image->comps[2].bpp = bluePrec;
    image->comps[2].prec = bluePrec;
    if (hasAlpha) {
        image->comps[3].bpp = alphaPrec;
        image->comps[3].prec = alphaPrec;
    }

    index = 0;
    pSrc = pData + (height - 1U) * stride;
    for (y = 0; y < height; y++) {
        for (x = 0; x < width; x++) {
            OPJ_UINT32 value = 0U;

            value |= ((OPJ_UINT32)pSrc[4 * x + 0]) <<  0;
            value |= ((OPJ_UINT32)pSrc[4 * x + 1]) <<  8;
            value |= ((OPJ_UINT32)pSrc[4 * x + 2]) << 16;
            value |= ((OPJ_UINT32)pSrc[4 * x + 3]) << 24;

            image->comps[0].data[index] = (OPJ_INT32)((value & redMask)   >>
                                          redShift);   /* R */
            image->comps[1].data[index] = (OPJ_INT32)((value & greenMask) >>
                                          greenShift); /* G */
            image->comps[2].data[index] = (OPJ_INT32)((value & blueMask)  >>
                                          blueShift);  /* B */
            if (hasAlpha) {
                image->comps[3].data[index] = (OPJ_INT32)((value & alphaMask)  >>
                                              alphaShift);  /* A */
            }
            index++;
        }
        pSrc -= stride;
    }
}